

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entries.cpp
# Opt level: O2

void duckdb::MapEntriesFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  bool bVar1;
  reference input;
  
  count = args->count;
  input = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  if ((input->type).id_ == SQLNULL) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  MapUtil::ReinterpretMap(result,input,count);
  bVar1 = DataChunk::AllConstant(args);
  if (bVar1) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  Vector::Verify(result,count);
  return;
}

Assistant:

static void MapEntriesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto count = args.size();

	auto &map = args.data[0];
	if (map.GetType().id() == LogicalTypeId::SQLNULL) {
		// Input is a constant NULL
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	MapUtil::ReinterpretMap(result, map, count);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(count);
}